

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.cpp
# Opt level: O3

void __thiscall
zmq::socks_basic_auth_request_t::socks_basic_auth_request_t
          (socks_basic_auth_request_t *this,string *username_,string *password_)

{
  pointer pcVar1;
  
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  pcVar1 = (username_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + username_->_M_string_length);
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  pcVar1 = (password_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->password,pcVar1,pcVar1 + password_->_M_string_length);
  if (0xff < username_->_M_string_length) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","username_.size () <= UINT8_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks.cpp"
            ,0x89);
    fflush(_stderr);
    zmq_abort("username_.size () <= UINT8_MAX");
  }
  if (0xff < password_->_M_string_length) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","password_.size () <= UINT8_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks.cpp"
            ,0x8a);
    fflush(_stderr);
    zmq_abort("password_.size () <= UINT8_MAX");
  }
  return;
}

Assistant:

zmq::socks_basic_auth_request_t::socks_basic_auth_request_t (
  const std::string &username_, const std::string &password_) :
    username (username_),
    password (password_)
{
    zmq_assert (username_.size () <= UINT8_MAX);
    zmq_assert (password_.size () <= UINT8_MAX);
}